

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O3

void __thiscall
mnf::Manifold::applyInvTransport
          (Manifold *this,RefMat *out,ConstRefMat *in,ConstRefVec *x,ConstRefVec *v)

{
  long lVar1;
  bool bVar2;
  Index IVar3;
  double local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long local_48;
  long local_40;
  
  if ((this->super_ValidManifold).flag_ != 0x677d7257) {
    puts(
        "It appears that you\'re trying to call a method from a manifold that does not exist              anymore. Possible cause: the manifold was statically created in a scope (e.g. a function) which was              left since then. For Stan: https://www.youtube.com/watch?v=Yy8MUnlT9Oo"
        );
    __assert_fail("isValid() || seeMessageAbove()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x103,
                  "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
                 );
  }
  lVar1 = (in->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  if (lVar1 != this->tangentDim_) {
    __assert_fail("in.rows() == tangentDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x104,
                  "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
                 );
  }
  if ((out->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != lVar1) {
    __assert_fail("out.rows() == tangentDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x105,
                  "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
                 );
  }
  if ((in->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value ==
      (out->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value) {
    lVar1 = (x->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_rows.m_value;
    IVar3 = representationDim(this);
    if (lVar1 != IVar3) {
      __assert_fail("x.size() == representationDim()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                    ,0x107,
                    "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
                   );
    }
    if ((v->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_rows.m_value == this->tangentDim_) {
      local_60 = 1e-08;
      bVar2 = isInTxM(this,x,v,&local_60);
      if (bVar2) {
        local_58 = *(undefined4 *)
                    &(out->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                     ).
                     super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                     .
                     super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                     .m_data;
        uStack_54 = *(undefined4 *)
                     ((long)&(out->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             ).
                             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             .
                             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_data + 4);
        uStack_50 = (undefined4)
                    (out->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value;
        uStack_4c = *(undefined4 *)
                     ((long)&(out->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                             ).
                             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             .
                             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                             .m_rows.m_value + 4);
        local_48 = (out->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value;
        local_40 = (out->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).m_stride.m_outer.m_value;
        (*this->_vptr_Manifold[0x1b])(this,&local_58,in,x,v);
        return;
      }
      __assert_fail("isInTxM(x, v)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                    ,0x109,
                    "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
                   );
    }
    __assert_fail("v.size() == tangentDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x108,
                  "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
                 );
  }
  __assert_fail("in.cols() == out.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0x106,
                "void mnf::Manifold::applyInvTransport(RefMat, const ConstRefMat &, const ConstRefVec &, const ConstRefVec &) const"
               );
}

Assistant:

Point Manifold::createPoint() const
{
  mnf_assert(isValid() || seeMessageAbove());
  lock();
  return Point(*this);
}